

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::PrimRect(ImDrawList *this,ImVec2 *a,ImVec2 *c,ImU32 col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ImVec2 IVar6;
  uint *puVar7;
  ImDrawVert *pIVar8;
  
  fVar1 = a->x;
  fVar2 = a->y;
  fVar3 = c->x;
  fVar4 = c->y;
  IVar6 = this->_Data->TexUvWhitePixel;
  uVar5 = this->_VtxCurrentIdx;
  puVar7 = this->_IdxWritePtr;
  *puVar7 = uVar5;
  puVar7[1] = uVar5 + 1;
  puVar7[2] = uVar5 + 2;
  puVar7[3] = uVar5;
  puVar7[4] = uVar5 + 2;
  puVar7[5] = uVar5 + 3;
  this->_VtxWritePtr->pos = *a;
  this->_VtxWritePtr->uv = IVar6;
  pIVar8 = this->_VtxWritePtr;
  pIVar8->col = col;
  pIVar8[1].pos.x = fVar3;
  pIVar8[1].pos.y = fVar2;
  this->_VtxWritePtr[1].uv = IVar6;
  pIVar8 = this->_VtxWritePtr;
  pIVar8[1].col = col;
  pIVar8[2].pos = *c;
  this->_VtxWritePtr[2].uv = IVar6;
  pIVar8 = this->_VtxWritePtr;
  pIVar8[2].col = col;
  pIVar8[3].pos.x = fVar1;
  pIVar8[3].pos.y = fVar4;
  this->_VtxWritePtr[3].uv = IVar6;
  pIVar8 = this->_VtxWritePtr;
  pIVar8[3].col = col;
  this->_VtxWritePtr = pIVar8 + 4;
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
  this->_IdxWritePtr = this->_IdxWritePtr + 6;
  return;
}

Assistant:

void ImDrawList::PrimRect(const ImVec2& a, const ImVec2& c, ImU32 col)
{
    ImVec2 b(c.x, a.y), d(a.x, c.y), uv(_Data->TexUvWhitePixel);
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}